

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeBufferApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::framebuffer_texture(NegativeTestContext *ctx)

{
  bool bVar1;
  ContextType ctxType;
  allocator<char> local_45;
  GLuint fbo;
  string local_40;
  GLuint texture [2];
  
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (bVar1) {
    fbo = 0x1234;
    texture[0] = 0x1234;
    texture[1] = 0x1234;
    glu::CallLogWrapper::glGenFramebuffers(&ctx->super_CallLogWrapper,1,&fbo);
    glu::CallLogWrapper::glBindFramebuffer(&ctx->super_CallLogWrapper,0x8d40,fbo);
    glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,2,texture);
    glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0xde1,texture[0]);
    glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x8c2a,texture[1]);
    NegativeTestContext::expectError(ctx,0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,
               "GL_INVALID_ENUM is generated if target is not one of the accepted tokens.",&local_45
              );
    NegativeTestContext::beginSection(ctx,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    glu::CallLogWrapper::glFramebufferTexture
              (&ctx->super_CallLogWrapper,0xffffffff,0x8ce0,texture[0],0);
    NegativeTestContext::expectError(ctx,0x500);
    NegativeTestContext::endSection(ctx);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,
               "GL_INVALID_ENUM is generated if attachment is not one of the accepted tokens.",
               &local_45);
    NegativeTestContext::beginSection(ctx,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    glu::CallLogWrapper::glFramebufferTexture
              (&ctx->super_CallLogWrapper,0x8d40,0xffffffff,texture[0],0);
    NegativeTestContext::expectError(ctx,0x500);
    NegativeTestContext::endSection(ctx);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,
               "GL_INVALID_OPERATION is generated if texture is neither 0 nor the name of an existing texture object."
               ,&local_45);
    NegativeTestContext::beginSection(ctx,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    glu::CallLogWrapper::glFramebufferTexture(&ctx->super_CallLogWrapper,0x8d40,0x8ce0,0xffffffff,0)
    ;
    NegativeTestContext::expectError(ctx,0x501);
    NegativeTestContext::endSection(ctx);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"GL_INVALID_OPERATION is generated if zero is bound to target.",
               &local_45);
    NegativeTestContext::beginSection(ctx,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    glu::CallLogWrapper::glBindFramebuffer(&ctx->super_CallLogWrapper,0x8d40,0);
    glu::CallLogWrapper::glFramebufferTexture(&ctx->super_CallLogWrapper,0x8d40,0x8ce0,0,0);
    NegativeTestContext::expectError(ctx,0x502);
    glu::CallLogWrapper::glBindFramebuffer(&ctx->super_CallLogWrapper,0x8d40,fbo);
    NegativeTestContext::endSection(ctx);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,
               "GL_INVALID_OPERATION is generated by if texture is a buffer texture.",&local_45);
    NegativeTestContext::beginSection(ctx,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    glu::CallLogWrapper::glFramebufferTexture(&ctx->super_CallLogWrapper,0x8d40,0x8ce0,texture[1],0)
    ;
    NegativeTestContext::expectError(ctx,0x502);
    NegativeTestContext::endSection(ctx);
    glu::CallLogWrapper::glDeleteFramebuffers(&ctx->super_CallLogWrapper,1,&fbo);
    glu::CallLogWrapper::glDeleteBuffers(&ctx->super_CallLogWrapper,2,texture);
  }
  return;
}

Assistant:

void framebuffer_texture (NegativeTestContext& ctx)
{
	if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)))
	{
		GLuint fbo = 0x1234;
		GLuint texture[] = {0x1234, 0x1234};

		ctx.glGenFramebuffers(1, &fbo);
		ctx.glBindFramebuffer(GL_FRAMEBUFFER, fbo);
		ctx.glGenTextures(2, texture);
		ctx.glBindTexture(GL_TEXTURE_2D, texture[0]);
		ctx.glBindTexture(GL_TEXTURE_BUFFER, texture[1]);
		ctx.expectError(GL_NO_ERROR);

		ctx.beginSection("GL_INVALID_ENUM is generated if target is not one of the accepted tokens.");
		ctx.glFramebufferTexture(-1, GL_COLOR_ATTACHMENT0, texture[0], 0);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.endSection();

		ctx.beginSection("GL_INVALID_ENUM is generated if attachment is not one of the accepted tokens.");
		ctx.glFramebufferTexture(GL_FRAMEBUFFER, -1, texture[0], 0);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.endSection();

		ctx.beginSection("GL_INVALID_OPERATION is generated if texture is neither 0 nor the name of an existing texture object.");
		ctx.glFramebufferTexture(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, -1, 0);
		ctx.expectError(GL_INVALID_VALUE);
		ctx.endSection();

		ctx.beginSection("GL_INVALID_OPERATION is generated if zero is bound to target.");
		ctx.glBindFramebuffer(GL_FRAMEBUFFER, 0);
		ctx.glFramebufferTexture(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, 0, 0);
		ctx.expectError(GL_INVALID_OPERATION);
		ctx.glBindFramebuffer(GL_FRAMEBUFFER, fbo);
		ctx.endSection();

		ctx.beginSection("GL_INVALID_OPERATION is generated by if texture is a buffer texture.");
		ctx.glFramebufferTexture(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, texture[1], 0);
		ctx.expectError(GL_INVALID_OPERATION);
		ctx.endSection();

		ctx.glDeleteFramebuffers(1, &fbo);
		ctx.glDeleteBuffers(2, texture);
	}
}